

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_functions.cpp
# Opt level: O1

ScalarFunctionSet * duckdb::ArrayDistanceFun::GetFunctions(void)

{
  scalar_function_t *__x;
  LogicalType varargs;
  LogicalType varargs_00;
  NotImplementedException *this;
  bind_scalar_function_t *pp_Var1;
  ScalarFunctionSet *in_RDI;
  bind_scalar_function_t *pp_Var2;
  pointer child;
  long lVar3;
  byte bVar4;
  initializer_list<duckdb::LogicalType> __l;
  initializer_list<duckdb::LogicalType> __l_00;
  ScalarFunction function;
  LogicalType array;
  undefined4 in_stack_fffffffffffffa64;
  undefined4 in_stack_fffffffffffffa6c;
  FunctionNullHandling in_stack_fffffffffffffa78;
  bind_lambda_function_t in_stack_fffffffffffffa80;
  scalar_function_t local_578;
  ScalarFunctionSet *local_550;
  _Any_data *local_548;
  _Any_data *local_540;
  vector<duckdb::ScalarFunction,_true> *local_538;
  bind_scalar_function_t *local_530;
  _func_int **local_528;
  LogicalType *local_520;
  LogicalType local_518;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_500;
  bind_scalar_function_t *local_4e8;
  bind_scalar_function_t *local_4e0;
  LogicalType *local_4d8;
  LogicalType *local_4d0;
  LogicalType *local_4c8;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_4c0;
  LogicalType local_4a8;
  string local_490;
  ScalarFunction local_470;
  LogicalType local_348;
  undefined1 local_330 [176];
  ScalarFunction local_280;
  ScalarFunction local_158;
  
  bVar4 = 0;
  local_490._M_dataplus._M_p = (pointer)&local_490.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_490,"array_distance","");
  local_550 = in_RDI;
  ScalarFunctionSet::ScalarFunctionSet(in_RDI,&local_490);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_490._M_dataplus._M_p != &local_490.field_2) {
    operator_delete(local_490._M_dataplus._M_p);
  }
  LogicalType::Real();
  local_4c8 = local_4c0.
              super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
              super__Vector_impl_data._M_finish;
  if (local_4c0.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_4c0.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    local_4d8 = &local_280.super_BaseScalarFunction.return_type;
    local_520 = &local_470.super_BaseScalarFunction.return_type;
    local_548 = (_Any_data *)&local_280.function;
    __x = &local_470.function;
    local_4e8 = &local_280.bind;
    local_530 = &local_470.bind;
    local_4d0 = &local_158.super_BaseScalarFunction.return_type;
    local_540 = (_Any_data *)&local_158.function;
    local_4e0 = &local_158.bind;
    local_528 = (_func_int **)&PTR__BaseScalarFunction_02474b40;
    local_538 = &(local_550->super_FunctionSet<duckdb::ScalarFunction>).functions;
    child = local_4c0.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
            _M_impl.super__Vector_impl_data._M_start;
    do {
      LogicalType::ARRAY(&local_348,child,(optional_idx)0xffffffffffffffff);
      if (child->id_ == DOUBLE) {
        LogicalType::LogicalType((LogicalType *)local_330,&local_348);
        LogicalType::LogicalType((LogicalType *)(local_330 + 0x18),&local_348);
        __l_00._M_len = 2;
        __l_00._M_array = (iterator)local_330;
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
                  (&local_500,__l_00,(allocator_type *)&stack0xfffffffffffffa87);
        LogicalType::LogicalType(&local_518,child);
        local_578.super__Function_base._M_functor._8_8_ = 0;
        local_578.super__Function_base._M_functor._M_unused._M_object =
             ArrayGenericFold<double,duckdb::DistanceOp>;
        local_578._M_invoker =
             ::std::
             _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
             ::_M_invoke;
        local_578.super__Function_base._M_manager =
             ::std::
             _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
             ::_M_manager;
        LogicalType::LogicalType(&local_4a8,INVALID);
        varargs_00.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0;
        varargs_00._0_8_ = &local_4a8;
        varargs_00.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
             in_stack_fffffffffffffa64;
        varargs_00.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
        _0_4_ = 0;
        varargs_00.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
        _4_4_ = in_stack_fffffffffffffa6c;
        ScalarFunction::ScalarFunction
                  (&local_470,(vector<duckdb::LogicalType,_true> *)&local_500,&local_518,&local_578,
                   ArrayGenericBinaryBind,(bind_scalar_function_extended_t)0x0,
                   (function_statistics_t)0x0,(init_local_state_t)0x0,varargs_00,CONSISTENT,
                   in_stack_fffffffffffffa78,in_stack_fffffffffffffa80);
        LogicalType::~LogicalType(&local_4a8);
        if (local_578.super__Function_base._M_manager != (_Manager_type)0x0) {
          (*local_578.super__Function_base._M_manager)
                    ((_Any_data *)&local_578,(_Any_data *)&local_578,__destroy_functor);
        }
        LogicalType::~LogicalType(&local_518);
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
                  (&local_500);
        lVar3 = 0x18;
        do {
          LogicalType::~LogicalType((LogicalType *)(local_330 + lVar3));
          lVar3 = lVar3 + -0x18;
        } while (lVar3 != -0x18);
        BaseScalarFunction::SetReturnsError
                  ((BaseScalarFunction *)local_330,&local_470.super_BaseScalarFunction);
        BaseScalarFunction::~BaseScalarFunction((BaseScalarFunction *)local_330);
        SimpleFunction::SimpleFunction((SimpleFunction *)&local_280,(SimpleFunction *)&local_470);
        local_280.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
             local_528;
        LogicalType::LogicalType(local_4d8,local_520);
        local_280.super_BaseScalarFunction.stability = local_470.super_BaseScalarFunction.stability;
        local_280.super_BaseScalarFunction.null_handling =
             local_470.super_BaseScalarFunction.null_handling;
        local_280.super_BaseScalarFunction.errors = local_470.super_BaseScalarFunction.errors;
        local_280.super_BaseScalarFunction.collation_handling =
             local_470.super_BaseScalarFunction.collation_handling;
        local_280.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
             (_func_int **)&PTR__ScalarFunction_024743d0;
        ::std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::
        function((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
                  *)local_548,__x);
        pp_Var1 = local_530;
        pp_Var2 = local_4e8;
        for (lVar3 = 9; lVar3 != 0; lVar3 = lVar3 + -1) {
          *pp_Var2 = *pp_Var1;
          pp_Var1 = pp_Var1 + (ulong)bVar4 * -2 + 1;
          pp_Var2 = pp_Var2 + (ulong)bVar4 * -2 + 1;
        }
        local_280.function_info.internal.
        super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             local_470.function_info.internal.
             super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        local_280.function_info.internal.
        super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
             = local_470.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
        if (local_470.function_info.internal.
            super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_470.function_info.internal.
             super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi)->_M_use_count =
                 (local_470.function_info.internal.
                  super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_470.function_info.internal.
             super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi)->_M_use_count =
                 (local_470.function_info.internal.
                  super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
          }
        }
        ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
        emplace_back<duckdb::ScalarFunction>
                  (&local_538->
                    super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
                   &local_280);
        local_280.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
             (_func_int **)&PTR__ScalarFunction_024743d0;
        if (local_280.function_info.internal.
            super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_280.function_info.internal.
                     super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if (local_280.function.super__Function_base._M_manager != (_Manager_type)0x0) {
          (*local_280.function.super__Function_base._M_manager)
                    (local_548,local_548,__destroy_functor);
        }
        BaseScalarFunction::~BaseScalarFunction(&local_280.super_BaseScalarFunction);
        local_470.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
             (_func_int **)&PTR__ScalarFunction_024743d0;
        if (local_470.function_info.internal.
            super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_470.function_info.internal.
                     super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if (local_470.function.super__Function_base._M_manager != (_Manager_type)0x0) {
          (*local_470.function.super__Function_base._M_manager)
                    ((_Any_data *)__x,(_Any_data *)__x,__destroy_functor);
        }
      }
      else {
        if (child->id_ != FLOAT) {
          this = (NotImplementedException *)__cxa_allocate_exception(0x10);
          local_470.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
               (_func_int **)
               &local_470.super_BaseScalarFunction.super_SimpleFunction.super_Function.name.
                _M_string_length;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_470,"Array function not implemented for type %s","");
          LogicalType::ToString_abi_cxx11_((string *)local_330,child);
          NotImplementedException::NotImplementedException<std::__cxx11::string>
                    (this,(string *)&local_470,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_330)
          ;
          __cxa_throw(this,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
        }
        LogicalType::LogicalType((LogicalType *)local_330,&local_348);
        LogicalType::LogicalType((LogicalType *)(local_330 + 0x18),&local_348);
        __l._M_len = 2;
        __l._M_array = (iterator)local_330;
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
                  (&local_500,__l,(allocator_type *)&stack0xfffffffffffffa87);
        LogicalType::LogicalType(&local_518,child);
        local_578.super__Function_base._M_functor._8_8_ = 0;
        local_578.super__Function_base._M_functor._M_unused._M_object =
             ArrayGenericFold<float,duckdb::DistanceOp>;
        local_578._M_invoker =
             ::std::
             _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
             ::_M_invoke;
        local_578.super__Function_base._M_manager =
             ::std::
             _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
             ::_M_manager;
        LogicalType::LogicalType(&local_4a8,INVALID);
        varargs.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0;
        varargs._0_8_ = &local_4a8;
        varargs.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
             in_stack_fffffffffffffa64;
        varargs.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
        _0_4_ = 0;
        varargs.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
        _4_4_ = in_stack_fffffffffffffa6c;
        ScalarFunction::ScalarFunction
                  (&local_470,(vector<duckdb::LogicalType,_true> *)&local_500,&local_518,&local_578,
                   ArrayGenericBinaryBind,(bind_scalar_function_extended_t)0x0,
                   (function_statistics_t)0x0,(init_local_state_t)0x0,varargs,CONSISTENT,
                   in_stack_fffffffffffffa78,in_stack_fffffffffffffa80);
        LogicalType::~LogicalType(&local_4a8);
        if (local_578.super__Function_base._M_manager != (_Manager_type)0x0) {
          (*local_578.super__Function_base._M_manager)
                    ((_Any_data *)&local_578,(_Any_data *)&local_578,__destroy_functor);
        }
        LogicalType::~LogicalType(&local_518);
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
                  (&local_500);
        lVar3 = 0x18;
        do {
          LogicalType::~LogicalType((LogicalType *)(local_330 + lVar3));
          lVar3 = lVar3 + -0x18;
        } while (lVar3 != -0x18);
        BaseScalarFunction::SetReturnsError
                  ((BaseScalarFunction *)local_330,&local_470.super_BaseScalarFunction);
        BaseScalarFunction::~BaseScalarFunction((BaseScalarFunction *)local_330);
        SimpleFunction::SimpleFunction((SimpleFunction *)&local_158,(SimpleFunction *)&local_470);
        local_158.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
             local_528;
        LogicalType::LogicalType(local_4d0,local_520);
        local_158.super_BaseScalarFunction.stability = local_470.super_BaseScalarFunction.stability;
        local_158.super_BaseScalarFunction.null_handling =
             local_470.super_BaseScalarFunction.null_handling;
        local_158.super_BaseScalarFunction.errors = local_470.super_BaseScalarFunction.errors;
        local_158.super_BaseScalarFunction.collation_handling =
             local_470.super_BaseScalarFunction.collation_handling;
        local_158.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
             (_func_int **)&PTR__ScalarFunction_024743d0;
        ::std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::
        function((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
                  *)local_540,__x);
        pp_Var1 = local_530;
        pp_Var2 = local_4e0;
        for (lVar3 = 9; lVar3 != 0; lVar3 = lVar3 + -1) {
          *pp_Var2 = *pp_Var1;
          pp_Var1 = pp_Var1 + (ulong)bVar4 * -2 + 1;
          pp_Var2 = pp_Var2 + (ulong)bVar4 * -2 + 1;
        }
        local_158.function_info.internal.
        super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             local_470.function_info.internal.
             super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        local_158.function_info.internal.
        super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
             = local_470.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
        if (local_470.function_info.internal.
            super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_470.function_info.internal.
             super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi)->_M_use_count =
                 (local_470.function_info.internal.
                  super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_470.function_info.internal.
             super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi)->_M_use_count =
                 (local_470.function_info.internal.
                  super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
          }
        }
        ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
        emplace_back<duckdb::ScalarFunction>
                  (&local_538->
                    super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
                   &local_158);
        local_158.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
             (_func_int **)&PTR__ScalarFunction_024743d0;
        if (local_158.function_info.internal.
            super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_158.function_info.internal.
                     super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if (local_158.function.super__Function_base._M_manager != (_Manager_type)0x0) {
          (*local_158.function.super__Function_base._M_manager)
                    (local_540,local_540,__destroy_functor);
        }
        BaseScalarFunction::~BaseScalarFunction(&local_158.super_BaseScalarFunction);
        local_470.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
             (_func_int **)&PTR__ScalarFunction_024743d0;
        if (local_470.function_info.internal.
            super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_470.function_info.internal.
                     super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if (local_470.function.super__Function_base._M_manager != (_Manager_type)0x0) {
          (*local_470.function.super__Function_base._M_manager)
                    ((_Any_data *)__x,(_Any_data *)__x,__destroy_functor);
        }
      }
      BaseScalarFunction::~BaseScalarFunction(&local_470.super_BaseScalarFunction);
      LogicalType::~LogicalType(&local_348);
      child = child + 1;
    } while (child != local_4c8);
  }
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_4c0);
  return local_550;
}

Assistant:

ScalarFunctionSet ArrayDistanceFun::GetFunctions() {
	ScalarFunctionSet set("array_distance");
	for (auto &type : LogicalType::Real()) {
		AddArrayFoldFunction<DistanceOp>(set, type);
	}
	return set;
}